

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O0

cmCommand * __thiscall cmMacroHelperCommand::Clone(cmMacroHelperCommand *this)

{
  cmMacroHelperCommand *this_00;
  cmMacroHelperCommand *newC;
  cmMacroHelperCommand *this_local;
  
  this_00 = (cmMacroHelperCommand *)operator_new(0xc0);
  cmMacroHelperCommand(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this_00->Args,&this->Args);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
            (&this_00->Functions,&this->Functions);
  std::__cxx11::string::operator=((string *)&this_00->FilePath,(string *)&this->FilePath);
  (this_00->Policies).Status.super__Base_bitset<4UL>._M_w[0] =
       (this->Policies).Status.super__Base_bitset<4UL>._M_w[0];
  (this_00->Policies).Status.super__Base_bitset<4UL>._M_w[1] =
       (this->Policies).Status.super__Base_bitset<4UL>._M_w[1];
  (this_00->Policies).Status.super__Base_bitset<4UL>._M_w[2] =
       (this->Policies).Status.super__Base_bitset<4UL>._M_w[2];
  (this_00->Policies).Status.super__Base_bitset<4UL>._M_w[3] =
       (this->Policies).Status.super__Base_bitset<4UL>._M_w[3];
  return &this_00->super_cmCommand;
}

Assistant:

virtual cmCommand* Clone()
  {
    cmMacroHelperCommand *newC = new cmMacroHelperCommand;
    // we must copy when we clone
    newC->Args = this->Args;
    newC->Functions = this->Functions;
    newC->FilePath = this->FilePath;
    newC->Policies = this->Policies;
    return newC;
  }